

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricQueryPoolCreatePrologue
          (ZETParameterValidation *this,zet_context_handle_t hContext,zet_device_handle_t hDevice,
          zet_metric_group_handle_t hMetricGroup,zet_metric_query_pool_desc_t *desc,
          zet_metric_query_pool_handle_t *phMetricQueryPool)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (((hMetricGroup != (zet_metric_group_handle_t)0x0 &&
        (hDevice != (zet_device_handle_t)0x0 && hContext != (zet_context_handle_t)0x0)) &&
      (zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER,
      phMetricQueryPool != (zet_metric_query_pool_handle_t *)0x0 &&
      desc != (zet_metric_query_pool_desc_t *)0x0)) &&
     (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, (int)desc->type < 2)) {
    zVar1 = ParameterValidation::validateExtensions<_zet_metric_query_pool_desc_t_const*>(desc);
    return zVar1;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricQueryPoolCreatePrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        zet_metric_group_handle_t hMetricGroup,         ///< [in] metric group associated with the query object.
        const zet_metric_query_pool_desc_t* desc,       ///< [in] metric query pool descriptor
        zet_metric_query_pool_handle_t* phMetricQueryPool   ///< [out] handle of metric query pool
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hMetricGroup )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phMetricQueryPool )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZET_METRIC_QUERY_POOL_TYPE_EXECUTION < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }